

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O0

int Res_WinCompute(Abc_Obj_t *pNode,int nWinTfiMax,int nWinTfoMax,Res_Win_t *p)

{
  int iVar1;
  Res_Win_t *p_local;
  int nWinTfoMax_local;
  int nWinTfiMax_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x1c5,"int Res_WinCompute(Abc_Obj_t *, int, int, Res_Win_t *)");
  }
  if ((0 < nWinTfiMax) && (nWinTfiMax < 10)) {
    if ((-1 < nWinTfoMax) && (nWinTfoMax < 10)) {
      p->pNode = pNode;
      p->nWinTfiMax = nWinTfiMax;
      p->nWinTfoMax = nWinTfoMax;
      Vec_PtrClear(p->vBranches);
      Vec_PtrClear(p->vDivs);
      Vec_PtrClear(p->vRoots);
      Vec_PtrPush(p->vRoots,pNode);
      iVar1 = Res_WinCollectLeavesAndNodes(p);
      if (iVar1 == 0) {
        pNode_local._4_4_ = 0;
      }
      else {
        if ((0 < p->nWinTfoMax) && (iVar1 = Res_WinComputeRoots(p), iVar1 != 0)) {
          Res_WinMarkPaths(p);
          iVar1 = Res_WinFinalizeRoots(p);
          if (iVar1 != 0) {
            Res_WinAddMissing(p);
          }
        }
        pNode_local._4_4_ = 1;
      }
      return pNode_local._4_4_;
    }
    __assert_fail("nWinTfoMax >= 0 && nWinTfoMax < 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                  ,0x1c7,"int Res_WinCompute(Abc_Obj_t *, int, int, Res_Win_t *)");
  }
  __assert_fail("nWinTfiMax > 0 && nWinTfiMax < 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resWin.c"
                ,0x1c6,"int Res_WinCompute(Abc_Obj_t *, int, int, Res_Win_t *)");
}

Assistant:

int Res_WinCompute( Abc_Obj_t * pNode, int nWinTfiMax, int nWinTfoMax, Res_Win_t * p )
{
    assert( Abc_ObjIsNode(pNode) );
    assert( nWinTfiMax > 0 && nWinTfiMax < 10 );
    assert( nWinTfoMax >= 0 && nWinTfoMax < 10 );

    // initialize the window
    p->pNode      = pNode;
    p->nWinTfiMax = nWinTfiMax;
    p->nWinTfoMax = nWinTfoMax;

    Vec_PtrClear( p->vBranches );
    Vec_PtrClear( p->vDivs );
    Vec_PtrClear( p->vRoots );
    Vec_PtrPush( p->vRoots, pNode );

    // compute the leaves
    if ( !Res_WinCollectLeavesAndNodes( p ) )
        return 0;

    // compute the candidate roots
    if ( p->nWinTfoMax > 0 && Res_WinComputeRoots(p) )
    {
        // mark the paths from the roots to the leaves
        Res_WinMarkPaths( p );
        // refine the roots and add branches and missing nodes
        if ( Res_WinFinalizeRoots( p ) )
            Res_WinAddMissing( p );
    }

    return 1;
}